

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O1

void __thiscall geometrycentral::surface::SurfaceMesh::greedilyOrientFaces(SurfaceMesh *this)

{
  bool bVar1;
  size_t sVar2;
  pointer puVar3;
  ParentMeshT *pPVar4;
  ulong uVar5;
  unsigned_long uVar6;
  long lVar7;
  size_t i_1;
  uint uVar8;
  size_t sVar9;
  ulong uVar10;
  size_t i_2;
  ulong uVar11;
  size_t sVar12;
  size_t i;
  uint uVar13;
  unsigned_long uVar14;
  ulong uVar15;
  bool bVar16;
  Face f_00;
  vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_> toProcess;
  Face fO;
  Face f;
  FaceData<double> processed;
  Face *local_a8;
  iterator iStack_a0;
  Face *local_98;
  SurfaceMesh *local_90;
  Face local_88;
  Face local_78;
  MeshData<geometrycentral::surface::Face,_double> local_68;
  
  local_a8 = (Face *)0x0;
  iStack_a0._M_current = (Face *)0x0;
  local_98 = (Face *)0x0;
  MeshData<geometrycentral::surface::Face,_double>::MeshData(&local_68,this,0.0);
  sVar2 = this->nFacesFillCount;
  if ((sVar2 == 0) ||
     (puVar3 = (this->fHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start, *puVar3 != 0xffffffffffffffff)) {
    sVar9 = 0;
  }
  else {
    sVar12 = 0;
    do {
      sVar9 = sVar2;
      if (sVar2 - 1 == sVar12) break;
      sVar9 = sVar12 + 1;
      lVar7 = sVar12 + 1;
      sVar12 = sVar9;
    } while (puVar3[lVar7] == 0xffffffffffffffff);
  }
  if (sVar9 != sVar2) {
    local_90 = this;
    do {
      local_78.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
      mesh = local_90;
      local_78.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
      ind = sVar9;
      if ((local_68.data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data[sVar9] == 0.0) &&
         (!NAN(local_68.data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data[sVar9]))) {
        if (iStack_a0._M_current == local_98) {
          ::std::
          vector<geometrycentral::surface::Face,std::allocator<geometrycentral::surface::Face>>::
          _M_realloc_insert<geometrycentral::surface::Face_const&>
                    ((vector<geometrycentral::surface::Face,std::allocator<geometrycentral::surface::Face>>
                      *)&local_a8,iStack_a0,&local_78);
        }
        else {
          ((iStack_a0._M_current)->
          super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>).mesh
               = local_90;
          ((iStack_a0._M_current)->
          super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>).ind
               = sVar9;
          iStack_a0._M_current = iStack_a0._M_current + 1;
        }
        local_68.data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_data[local_78.
               super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
               ind] = 1.0;
        while (local_a8 != iStack_a0._M_current) {
          pPVar4 = iStack_a0._M_current[-1].
                   super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                   .mesh;
          uVar5 = (pPVar4->fHalfedgeArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start
                  [iStack_a0._M_current[-1].
                   super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                   .ind];
          uVar15 = uVar5;
          iStack_a0._M_current = iStack_a0._M_current + -1;
          do {
            bVar1 = pPVar4->useImplicitTwinFlag;
            if (bVar1 == true) {
              uVar10 = uVar15 >> 1;
            }
            else {
              uVar10 = (pPVar4->heEdgeArr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar15];
            }
            if (bVar1 == false) {
              uVar6 = (pPVar4->eHalfedgeArr).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar10];
              bVar16 = (pPVar4->heSiblingArr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar6] == uVar6;
            }
            else {
              bVar16 = pPVar4->nFacesFillCount <=
                       (pPVar4->heFaceArr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar10 * 2 + 1];
            }
            if (!bVar16) {
              if (bVar1 == false) {
                uVar10 = (pPVar4->heEdgeArr).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar15];
                uVar6 = (pPVar4->heSiblingArr).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start
                        [(pPVar4->heSiblingArr).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start
                         [(pPVar4->eHalfedgeArr).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar10]]];
                uVar14 = (pPVar4->eHalfedgeArr).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar10];
              }
              else {
                uVar10 = uVar15 >> 1;
                uVar6 = uVar10 * 2;
                uVar14 = uVar10 * 2;
              }
              if (uVar6 != uVar14) {
                if (bVar1 == false) {
                  uVar11 = (pPVar4->heSiblingArr).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start
                           [(pPVar4->eHalfedgeArr).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar10]];
                  uVar10 = (pPVar4->eHalfedgeArr).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar10];
                }
                else {
                  uVar11 = uVar10 * 2 ^ 1;
                  uVar10 = uVar10 * 2;
                }
                if (uVar11 != uVar10) goto LAB_00163ed2;
              }
              if (bVar1 == false) {
                uVar10 = (pPVar4->heSiblingArr).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar15];
              }
              else {
                uVar10 = uVar15 ^ 1;
              }
              local_88.
              super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
              ind = (pPVar4->heFaceArr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar10];
              local_88.
              super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
              mesh = pPVar4;
              if ((local_68.data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data
                   [local_88.
                    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                    .ind] == 0.0) &&
                 (!NAN(local_68.data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data
                       [local_88.
                        super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                        .ind]))) {
                if (bVar1 == false) {
                  uVar10 = (pPVar4->eHalfedgeArr).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start
                           [(pPVar4->heEdgeArr).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar15]];
                  uVar11 = (pPVar4->heSiblingArr).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar10];
                }
                else {
                  uVar10 = uVar15 & 0xfffffffffffffffe;
                  uVar11 = uVar10 ^ 1;
                }
                if (uVar10 != uVar11) {
                  uVar11 = uVar10;
                  if (bVar1 == false) {
                    uVar11 = (pPVar4->heSiblingArr).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start
                             [(pPVar4->heSiblingArr).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar10]];
                  }
                  if (uVar11 == uVar10) {
                    if (bVar1 == false) {
                      uVar13 = (uint)(pPVar4->heOrientArr).
                                     super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                     super__Vector_impl_data._M_start[uVar10];
                      uVar8 = (uint)(pPVar4->heOrientArr).
                                    super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                    super__Vector_impl_data._M_start
                                    [(pPVar4->heSiblingArr).
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar10]];
                    }
                    else {
                      uVar13 = ~(uint)uVar10 & 1;
                      uVar8 = ~((uint)uVar10 ^ 1) & 1;
                    }
                    if ((uVar8 != 0) != (uVar13 != 0)) goto LAB_00163e97;
                  }
                  f_00.
                  super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                  .ind = local_88.
                         super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                         .ind;
                  f_00.
                  super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                  .mesh = pPVar4;
                  invertOrientation(local_90,f_00);
                }
LAB_00163e97:
                if (iStack_a0._M_current == local_98) {
                  ::std::
                  vector<geometrycentral::surface::Face,std::allocator<geometrycentral::surface::Face>>
                  ::_M_realloc_insert<geometrycentral::surface::Face_const&>
                            ((vector<geometrycentral::surface::Face,std::allocator<geometrycentral::surface::Face>>
                              *)&local_a8,iStack_a0,&local_88);
                }
                else {
                  ((iStack_a0._M_current)->
                  super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                  ).mesh = local_88.
                           super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                           .mesh;
                  ((iStack_a0._M_current)->
                  super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                  ).ind = local_88.
                          super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                          .ind;
                  iStack_a0._M_current = iStack_a0._M_current + 1;
                }
                local_68.data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data
                [local_88.
                 super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                 .ind] = 1.0;
              }
            }
LAB_00163ed2:
            uVar15 = (pPVar4->heNextArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar15];
          } while (uVar15 != uVar5);
        }
      }
      sVar12 = sVar9;
      do {
        sVar9 = sVar2;
        if (sVar2 - 1 == sVar12) break;
        sVar9 = sVar12 + 1;
        lVar7 = sVar12 + 1;
        sVar12 = sVar9;
      } while ((local_90->fHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar7] == 0xffffffffffffffff);
    } while (sVar9 != sVar2);
  }
  MeshData<geometrycentral::surface::Face,_double>::~MeshData(&local_68);
  if (local_a8 != (Face *)0x0) {
    operator_delete(local_a8);
  }
  return;
}

Assistant:

void SurfaceMesh::greedilyOrientFaces() {
  // TODO this is only lightly tested. Write some better tests.
  std::vector<Face> toProcess;
  FaceData<double> processed(*this, false);
  for (Face f : faces()) {
    if (processed[f]) continue;

    // start a new search
    toProcess.push_back(f);
    processed[f] = true;

    // cover the whole component
    while (!toProcess.empty()) {
      Face curr = toProcess.back();
      toProcess.pop_back();

      for (Halfedge he : curr.adjacentHalfedges()) {
        if (he.edge().isBoundary() || !he.edge().isManifold()) continue;
        Face fO = he.sibling().face();
        if (processed[fO]) continue;

        if (!he.edge().isOriented()) {
          invertOrientation(fO);
        }

        toProcess.push_back(fO);
        processed[fO] = true;
      }
    }
  }
}